

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O3

void __thiscall
dg::llvmdg::SDGBuilder::buildBBlock(SDGBuilder *this,DependenceGraph *dg,BasicBlock *B)

{
  DepDGElement *pDVar1;
  SystemDependenceGraph *pSVar2;
  DGBBlock *pDVar3;
  mapped_type *ppDVar4;
  DepDGElement *n;
  DepDGElement *pDVar5;
  mapped_type *ppDVar6;
  mapped_type *ppVVar7;
  BasicBlock *pBVar8;
  DepDGElement *local_60;
  DGFormalParameters *local_58;
  DependenceGraph *local_50;
  DGBBlock *local_48;
  BasicBlock *local_40;
  DepDGElement *local_38;
  
  pDVar3 = sdg::DependenceGraph::createBBlock(dg);
  local_60 = (DepDGElement *)B;
  ppDVar4 = std::
            map<const_llvm::BasicBlock_*,_dg::sdg::DGBBlock_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
            ::operator[]((map<const_llvm::BasicBlock_*,_dg::sdg::DGBBlock_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
                          *)(this->_llvmsdg + 0x120),(key_type *)&local_60);
  *ppDVar4 = pDVar3;
  pBVar8 = *(BasicBlock **)(B + 0x30);
  local_40 = B + 0x28;
  if (pBVar8 != local_40) {
    local_58 = &dg->_parameters;
    local_50 = dg;
    local_48 = pDVar3;
    do {
      pDVar1 = (DepDGElement *)(pBVar8 + -0x18);
      if (pBVar8 == (BasicBlock *)0x0) {
        pDVar1 = (DepDGElement *)0x0;
LAB_001062ec:
        n = (DepDGElement *)sdg::DependenceGraph::createInstruction(dg);
        if (pDVar1->field_0x10 == '\x1c') {
          pDVar5 = (DepDGElement *)(dg->_parameters).super_DGParameters._return;
          if (pDVar5 == (DepDGElement *)0x0) {
            pDVar5 = (DepDGElement *)::dg::sdg::DGParameters::createReturn();
          }
          local_60 = pDVar5;
          std::
          _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
          ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                    ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                      *)&n->_use_deps,&local_60);
          local_60 = n;
          std::
          _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
          ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                    ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                      *)&pDVar5->_rev_use_deps,&local_60);
          dg = local_50;
        }
      }
      else {
        if (pBVar8[-8] != (BasicBlock)0x53) goto LAB_001062ec;
        n = (DepDGElement *)buildCallNode(this,dg,(CallInst *)pDVar1);
      }
      sdg::DGBBlock::append(local_48,(DGNode *)n);
      pSVar2 = this->_llvmsdg;
      local_60 = pDVar1;
      local_38 = n;
      ppDVar6 = std::
                map<const_llvm::Value_*,_dg::sdg::DGElement_*,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::sdg::DGElement_*>_>_>
                ::operator[]((map<const_llvm::Value_*,_dg::sdg::DGElement_*,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::sdg::DGElement_*>_>_>
                              *)(pSVar2 + 0x90),(key_type *)&local_60);
      pDVar1 = local_60;
      *ppDVar6 = &n->super_DGElement;
      ppVVar7 = std::
                map<const_dg::sdg::DGElement_*,_llvm::Value_*,_std::less<const_dg::sdg::DGElement_*>,_std::allocator<std::pair<const_dg::sdg::DGElement_*const,_llvm::Value_*>_>_>
                ::operator[]((map<const_dg::sdg::DGElement_*,_llvm::Value_*,_std::less<const_dg::sdg::DGElement_*>,_std::allocator<std::pair<const_dg::sdg::DGElement_*const,_llvm::Value_*>_>_>
                              *)(pSVar2 + 0xc0),(key_type *)&local_38);
      *ppVVar7 = (mapped_type)pDVar1;
      pBVar8 = *(BasicBlock **)(pBVar8 + 8);
    } while (pBVar8 != local_40);
  }
  return;
}

Assistant:

void buildBBlock(sdg::DependenceGraph &dg, llvm::BasicBlock &B) {
        auto &block = dg.createBBlock();
        _llvmsdg->addBlkMapping(&B, &block);

        for (auto &I : B) {
            sdg::DGNode *node = nullptr;
            if (auto *CI = llvm::dyn_cast<llvm::CallInst>(&I)) {
                node = &buildCallNode(dg, CI);
            } else {
                node = &dg.createInstruction();
                if (llvm::isa<llvm::ReturnInst>(I)) {
                    // add formal 'ret' parameter
                    auto &params = dg.getParameters();
                    auto *ret = params.getReturn();
                    if (!ret)
                        ret = &params.createReturn();
                    // XXX: do we want the 'use' edge here?
                    node->addUser(*ret);
                }
            }
            assert(node && "Failed creating a node");

            block.append(node);
            _llvmsdg->addMapping(&I, node);
        }
    }